

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_sorting.cpp
# Opt level: O2

void sorting::grayscale(vector<Palette,_std::allocator<Palette>_> *palettes,
                       array<std::optional<Rgba>,_32769UL> *colors)

{
  Rgba *this;
  pointer pPVar1;
  byte bVar2;
  uint16_t uVar3;
  long lVar4;
  
  Options::verbosePrint(&options,'\x02',"Sorting grayscale-only palette...\n");
  pPVar1 = (palettes->super__Vector_base<Palette,_std::allocator<Palette>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(palettes->super__Vector_base<Palette,_std::allocator<Palette>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pPVar1 == 8) {
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 2) {
      *(undefined2 *)((long)(pPVar1->colors)._M_elems + lVar4) = 0x8000;
    }
    for (lVar4 = 0; lVar4 != 0x28005; lVar4 = lVar4 + 5) {
      if (((&colors->_M_elems[0].super__Optional_base<Rgba,_true,_true>._M_payload.
             super__Optional_payload_base<Rgba>._M_engaged)[lVar4] == true) &&
         (0xf < *(byte *)((long)&colors->_M_elems[0].super__Optional_base<Rgba,_true,_true>.
                                 _M_payload.super__Optional_payload_base<Rgba>._M_payload +
                         lVar4 + 3))) {
        this = (Rgba *)((long)&colors->_M_elems[0].super__Optional_base<Rgba,_true,_true>._M_payload
                               .super__Optional_payload_base<Rgba>._M_payload + lVar4);
        uVar3 = Rgba::cgbColor(this);
        bVar2 = Rgba::grayIndex(this);
        (pPVar1->colors)._M_elems[bVar2] = uVar3;
      }
    }
    return;
  }
  __assert_fail("palettes.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_sorting.cpp"
                ,0x34,
                "void sorting::grayscale(std::vector<Palette> &, const std::array<std::optional<Rgba>, 32769> &)"
               );
}

Assistant:

void grayscale(std::vector<Palette> &palettes,
               std::array<std::optional<Rgba>, 0x8001> const &colors) {
	options.verbosePrint(Options::VERB_LOG_ACT, "Sorting grayscale-only palette...\n");

	// This method is only applicable if there are at most as many colors as colors per palette, so
	// we should only have a single palette.
	assert(palettes.size() == 1);

	Palette &palette = palettes[0];
	std::fill(palette.colors.begin(), palette.colors.end(), Rgba::transparent);
	for (auto const &slot : colors) {
		if (!slot.has_value() || slot->isTransparent()) {
			continue;
		}
		palette[slot->grayIndex()] = slot->cgbColor();
	}
}